

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O2

Vec3fa __thiscall
embree::renderPixelAOShader
          (embree *this,DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
          RTCFeatureFlags feature_mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  Vec3fa VVar17;
  undefined1 local_1c8 [16];
  Vec3fa Nf;
  undefined4 local_158;
  RTCFeatureFlags local_154;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  Ray shadow;
  Sample3f dir;
  Ray ray;
  undefined1 auVar16 [16];
  
  ray.org.field_0.m128[2] =
       (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  ray.org.field_0._0_8_ = *(undefined8 *)&(camera->xfm).p.field_0;
  fVar8 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
          (camera->xfm).l.vz.field_0.field_0.x;
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar3 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar9 = y * (float)uVar2 + (float)uVar1 * x + (float)uVar3;
  fVar10 = y * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * x +
           (float)((ulong)uVar3 >> 0x20);
  fVar11 = fVar8 * fVar8 + fVar9 * fVar9 + fVar10 * fVar10;
  auVar12 = rsqrtss(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  fVar13 = auVar12._0_4_;
  fVar11 = fVar13 * fVar13 * fVar11 * -0.5 * fVar13 + fVar13 * 1.5;
  ray.dir.field_0.m128[1] = fVar11 * fVar9;
  ray.dir.field_0.m128[0] = fVar8 * fVar11;
  ray.dir.field_0.m128[2] = fVar11 * fVar10;
  ray.org.field_0.m128[3] = 0.0;
  ray.tfar = INFINITY;
  ray.mask = 0xffffffff;
  ray.primID = 0xffffffff;
  ray.geomID = 0xffffffff;
  fVar8 = 0.0;
  fVar9 = 0.0;
  ray.dir.field_0.m128[3] = data->debug;
  rtcTraversableIntersect1(data->traversable,&ray);
  stats->numRays = stats->numRays + 1;
  if (ray.geomID == 0xffffffff) {
    fVar10 = 0.0;
    local_1c8._4_4_ = 0;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    fVar9 = (float)ray.Ng.field_0._4_8_;
    fVar10 = (float)((ulong)ray.Ng.field_0._4_8_ >> 0x20);
    fVar8 = ray.Ng.field_0.field_0.x * ray.Ng.field_0.field_0.x + fVar9 * fVar9 + fVar10 * fVar10;
    auVar12 = rsqrtss(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    fVar11 = auVar12._0_4_;
    fVar11 = fVar11 * 1.5 - fVar11 * fVar11 * fVar8 * 0.5 * fVar11;
    fVar8 = ray.Ng.field_0.field_0.x * fVar11;
    fVar9 = fVar11 * fVar9;
    fVar11 = fVar11 * fVar10;
    local_1c8 = ZEXT416(0);
    Nf.field_0.m128[3] = 0.0;
    Nf.field_0.m128[0] = fVar8;
    Nf.field_0.m128[1] = fVar9;
    Nf.field_0.m128[2] = fVar11;
    if (0.0 <= ray.dir.field_0.m128[2] * fVar11 +
               ray.dir.field_0.m128[1] * fVar9 + ray.dir.field_0.m128[0] * fVar8) {
      Nf.field_0.m128[3] = -0.0;
      Nf.field_0.m128[0] = -fVar8;
      Nf.field_0.m128[1] = -fVar9;
      Nf.field_0.m128[2] = -fVar11;
    }
    fVar10 = ray.dir.field_0.m128[1] * ray.dir.field_0.m128[1];
    fVar13 = ray.dir.field_0.m128[2] * ray.dir.field_0.m128[2];
    fVar14 = ray.dir.field_0.m128[3] * ray.dir.field_0.m128[3];
    fVar15 = fVar10 + ray.dir.field_0.m128[0] * ray.dir.field_0.m128[0] + fVar13;
    auVar16._0_8_ = CONCAT44(fVar10 + fVar10 + fVar14,fVar15);
    auVar16._8_4_ = fVar10 + fVar13 + fVar13;
    auVar16._12_4_ = fVar10 + fVar14 + fVar14;
    auVar12._8_4_ = auVar16._8_4_;
    auVar12._0_8_ = auVar16._0_8_;
    auVar12._12_4_ = auVar16._12_4_;
    auVar12 = rsqrtss(auVar12,auVar16);
    fVar10 = auVar12._0_4_;
    fVar10 = fVar10 * 1.5 - fVar10 * fVar10 * fVar15 * 0.5 * fVar10;
    fVar9 = ABS(fVar11 * fVar10 * ray.dir.field_0.m128[2] +
                fVar9 * fVar10 * ray.dir.field_0.m128[1] + fVar8 * fVar10 * ray.dir.field_0.m128[0])
            * 0.8 + 0.3;
    fVar8 = 1.0;
    if (fVar9 <= 1.0) {
      fVar8 = fVar9;
    }
    fVar9 = ray.tfar * ray.dir.field_0.m128[0] + ray.org.field_0.m128[0];
    fVar10 = ray.tfar * ray.dir.field_0.m128[1] + ray.org.field_0.m128[1];
    fVar11 = ray.tfar * ray.dir.field_0.m128[2] + ray.org.field_0.m128[2];
    uVar5 = (int)y << 0x10 | (int)x;
    uVar5 = uVar5 * -0x3361d2af >> 0x11 | uVar5 * 0x16a88000;
    uVar5 = (uVar5 * -0x194da000 | uVar5 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (uVar5 * 0x2000 | uVar5 >> 0x13) * 5 + 0xe6546b64;
    uVar5 = (uVar5 >> 0x10 ^ uVar5) * -0x7a143595;
    uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
    uVar5 = uVar5 >> 0x10 ^ uVar5;
    iVar6 = 0x40;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      iVar4 = uVar5 * 0x19660d;
      uVar5 = uVar5 * 0x17385ca9 + 0x47502932;
      cosineSampleHemisphere
                (&dir,(float)(iVar4 + 0x3c6ef35fU >> 1) * 4.656613e-10,
                 (float)(uVar5 >> 1) * 4.656613e-10,&Nf);
      shadow.org.field_0._0_8_ = CONCAT44(fVar10,fVar9);
      shadow.dir.field_0._0_8_ = dir.v.field_0._0_8_;
      shadow.org.field_0.m128[3] = 0.001;
      shadow.org.field_0.m128[2] = fVar11;
      shadow.tfar = INFINITY;
      shadow.mask = 0xffffffff;
      shadow.primID = 0xffffffff;
      shadow.geomID = 0xffffffff;
      local_158 = 0;
      local_140 = 0;
      shadow.dir.field_0.m128[2] = (float)dir.v.field_0._8_8_;
      shadow.dir.field_0.m128[3] = data->debug;
      local_150 = 0;
      uStack_148 = 0;
      local_154 = feature_mask;
      rtcTraversableOccluded1(data->traversable,&shadow,&local_158);
      stats->numRays = stats->numRays + 1;
      local_1c8._0_4_ =
           local_1c8._0_4_ & -(uint)(shadow.tfar < 0.0) |
           ~-(uint)(shadow.tfar < 0.0) & (uint)((float)local_1c8._0_4_ + 1.0);
    }
    fVar10 = (float)local_1c8._0_4_ * 0.015625;
    fVar8 = fVar8 * fVar10;
    *(float *)this = fVar8;
    *(float *)(this + 4) = fVar8;
    *(float *)(this + 8) = fVar8;
    *(float *)(this + 0xc) = fVar8;
    fVar9 = fVar8;
  }
  VVar17.field_0.m128[1] = (float)local_1c8._4_4_;
  VVar17.field_0.m128[0] = fVar10;
  VVar17.field_0.m128[3] = fVar9;
  VVar17.field_0.m128[2] = fVar8;
  return (Vec3fa)VVar17.field_0;
}

Assistant:

Vec3fa renderPixelAOShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.feature_mask = feature_mask;
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade pixel */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);

  Vec3fa Ng = normalize(ray.Ng);
  Vec3fa Nf = faceforward(Ng,ray.dir,Ng);
  Vec3fa col = Vec3fa(min(1.f,.3f+.8f*abs(dot(Ng,normalize(ray.dir)))));

  /* calculate hit point */
  float intensity = 0;
  Vec3fa hitPos = ray.org + ray.tfar * ray.dir;

#define AMBIENT_OCCLUSION_SAMPLES 64
  /* trace some ambient occlusion rays */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);
  for (int i=0; i<AMBIENT_OCCLUSION_SAMPLES; i++)
  {
    Vec2f sample = RandomSampler_get2D(sampler);
    Sample3f dir = cosineSampleHemisphere(sample.x,sample.y,Nf);

    /* initialize shadow ray */
    Ray shadow;
    shadow.org = Vec3ff(hitPos);
    shadow.dir = Vec3ff(dir.v);
    shadow.tnear() = 0.001f;
    shadow.tfar = inf;
    shadow.geomID = RTC_INVALID_GEOMETRY_ID;
    shadow.primID = RTC_INVALID_GEOMETRY_ID;
    shadow.mask = -1;
    shadow.time() = data.debug;

    /* trace shadow ray */
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(shadow),&args);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      intensity += 1.0f;
  }
  intensity *= 1.0f/AMBIENT_OCCLUSION_SAMPLES;

  /* shade pixel */
  return col * intensity;
}